

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

vector3 * vector3_rotate_by_quaternion(vector3 *self,quaternion *qT)

{
  anon_union_32_3_07544b10_for_quaternion_0 local_58;
  anon_union_32_3_07544b10_for_quaternion_0 local_38;
  
  local_58._0_4_ = *(undefined4 *)&qT->field_0;
  local_58._4_4_ = *(uint *)((long)&qT->field_0 + 4);
  local_58._8_4_ = *(undefined4 *)((long)&qT->field_0 + 8);
  local_58._12_4_ = *(uint *)((long)&qT->field_0 + 0xc);
  local_38._4_4_ = local_58._4_4_ ^ 0x80000000;
  local_38._12_4_ = local_58._12_4_ ^ 0x80000000;
  local_58._16_4_ = *(undefined4 *)((long)&qT->field_0 + 0x10);
  local_58._20_4_ = *(uint *)((long)&qT->field_0 + 0x14);
  local_58._24_4_ = *(undefined4 *)((long)&qT->field_0 + 0x18);
  local_58._28_4_ = *(undefined4 *)((long)&qT->field_0 + 0x1c);
  local_38._20_4_ = local_58._20_4_ ^ 0x80000000;
  local_38._0_4_ = local_58._0_4_;
  local_38._8_4_ = local_58._8_4_;
  local_38._16_4_ = local_58._16_4_;
  local_38._24_4_ = local_58._24_4_;
  local_38._28_4_ = local_58._28_4_;
  quaternion_multiplyv3((quaternion *)&local_58.field_1,self);
  quaternion_multiply((quaternion *)&local_58.field_1,(quaternion *)&local_38.field_1);
  (self->field_0).v[0] = (double)CONCAT44(local_58._4_4_,local_58._0_4_);
  (self->field_0).v[1] = (double)CONCAT44(local_58._12_4_,local_58._8_4_);
  (self->field_0).v[2] = (double)CONCAT44(local_58._20_4_,local_58._16_4_);
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_rotate_by_quaternion(struct vector3 *self, const struct quaternion *qT)
{
	struct quaternion qconj;
	struct quaternion q;

	/* make the conjugate */
	quaternion_set(&qconj, qT);
	quaternion_conjugate(&qconj);

	quaternion_set(&q, qT);
	quaternion_multiplyv3(&q, self);
	quaternion_multiply(&q, &qconj);

	self->x = q.x;
	self->y = q.y;
	self->z = q.z;

	return self;
}